

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

FlattenedField * __thiscall
kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
          (ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this,
          FlattenedField *params)

{
  RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *pRVar1;
  FlattenedField *pFVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  
  pRVar1 = this->pos;
  (pRVar1->ownName).content.ptr = (params->ownName).content.ptr;
  (pRVar1->ownName).content.size_ = (params->ownName).content.size_;
  (pRVar1->ownName).content.disposer = (params->ownName).content.disposer;
  (params->ownName).content.ptr = (char *)0x0;
  (params->ownName).content.size_ = 0;
  sVar3 = (params->name).content.size_;
  (pRVar1->name).content.ptr = (params->name).content.ptr;
  (pRVar1->name).content.size_ = sVar3;
  (pRVar1->type).tag = (params->type).tag;
  if ((params->type).tag == 1) {
    uVar4 = *(undefined8 *)&(params->type).field_1;
    uVar5 = *(undefined8 *)((long)&(params->type).field_1 + 8);
    uVar6 = *(undefined8 *)((long)&(params->type).field_1 + 0x10);
    uVar7 = *(undefined8 *)((long)&(params->type).field_1 + 0x18);
    uVar8 = *(undefined8 *)((long)&(params->type).field_1 + 0x20);
    uVar9 = *(undefined8 *)((long)&(params->type).field_1 + 0x28);
    uVar10 = *(undefined8 *)((long)&(params->type).field_1 + 0x38);
    *(undefined8 *)((long)&(pRVar1->type).field_1 + 0x30) =
         *(undefined8 *)((long)&(params->type).field_1 + 0x30);
    *(undefined8 *)((long)&(pRVar1->type).field_1 + 0x38) = uVar10;
    *(undefined8 *)((long)&(pRVar1->type).field_1 + 0x20) = uVar8;
    *(undefined8 *)((long)&(pRVar1->type).field_1 + 0x28) = uVar9;
    *(undefined8 *)((long)&(pRVar1->type).field_1 + 0x10) = uVar6;
    *(undefined8 *)((long)&(pRVar1->type).field_1 + 0x18) = uVar7;
    *(undefined8 *)&(pRVar1->type).field_1 = uVar4;
    *(undefined8 *)((long)&(pRVar1->type).field_1 + 8) = uVar5;
  }
  if ((params->type).tag == 2) {
    uVar4 = *(undefined8 *)((long)&(params->type).field_1 + 8);
    *(undefined8 *)&(pRVar1->type).field_1 = *(undefined8 *)&(params->type).field_1;
    *(undefined8 *)((long)&(pRVar1->type).field_1 + 8) = uVar4;
  }
  capnp::DynamicValue::Reader::Reader(&pRVar1->value,&params->value);
  pFVar2 = this->pos;
  this->pos = pFVar2 + 1;
  return pFVar2;
}

Assistant:

T& add(Params&&... params) KJ_LIFETIMEBOUND {
    KJ_IREQUIRE(pos < endPtr, "Added too many elements to ArrayBuilder.");
    ctor(*pos, kj::fwd<Params>(params)...);
    return *pos++;
  }